

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Detail::Approx::setEpsilon(Approx *this,double newEpsilon)

{
  string local_40;
  ReusableStringStream local_20;
  
  if ((0.0 <= newEpsilon) && (newEpsilon <= 1.0)) {
    this->m_epsilon = newEpsilon;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.m_oss,"Invalid Approx::epsilon: ",0x19);
  std::ostream::_M_insert<double>(newEpsilon);
  local_40._M_dataplus._M_p._0_1_ = 0x2e;
  std::__ostream_insert<char,std::char_traits<char>>(local_20.m_oss,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_20.m_oss," Approx::epsilon has to be in [0, 1]",0x24);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_40);
}

Assistant:

void Approx::setEpsilon(double newEpsilon) {
        CATCH_ENFORCE(newEpsilon >= 0 && newEpsilon <= 1.0,
            "Invalid Approx::epsilon: " << newEpsilon << '.'
            << " Approx::epsilon has to be in [0, 1]");
        m_epsilon = newEpsilon;
    }